

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  int iVar1;
  const_reference pvVar2;
  int in_ESI;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  if (-1 < in_ESI) {
    iVar1 = total_part_count((TestResult *)0x6480f0);
    in_stack_ffffffffffffffe4 = in_ESI;
    if (in_ESI < iVar1) goto LAB_006480ff;
  }
  in_ESI = in_stack_ffffffffffffffe4;
  internal::posix::Abort();
LAB_006480ff:
  pvVar2 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::at
                     ((vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *)
                      CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return pvVar2;
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(i);
}